

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

QByteArray *
qCreatev2Hash(QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *ctx,QNtlmPhase3Block *phase3
             )

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView message;
  QCryptographicHash md4;
  QByteArray local_118;
  QString local_100;
  QByteArray local_e8;
  QStringBuilder<QByteArray,_QByteArray> local_c8;
  QByteArray local_98;
  QByteArray local_78;
  QByteArray local_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((phase3->v2Hash).d.size == 0) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QCryptographicHash::QCryptographicHash((QCryptographicHash *)&local_40,Md4);
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    qStringAsUcs2Le(&local_58,&ctx->password);
    QVar5.m_data = (storage_type *)local_58.d.size;
    QVar5.m_size = (qsizetype)&local_40;
    QCryptographicHash::addData(QVar5);
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QCryptographicHash::result();
    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QString::toUpper_helper((QString *)&local_100);
    qStringAsUcs2Le(&local_e8,&local_100);
    qStringAsUcs2Le(&local_118,&phase3->domainStr);
    local_c8.a.d.size = local_e8.d.size;
    local_c8.a.d.ptr = local_e8.d.ptr;
    local_c8.a.d.d = local_e8.d.d;
    local_c8.b.d.size = local_118.d.size;
    local_c8.b.d.ptr = local_118.d.ptr;
    local_c8.b.d.d = local_118.d.d;
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = (char *)0x0;
    local_e8.d.size = 0;
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = (char *)0x0;
    local_118.d.size = 0;
    QStringBuilder<QByteArray,_QByteArray>::convertTo<QByteArray>(&local_98,&local_c8);
    QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder(&local_c8);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_100.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_100.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_100.d.d)->super_QArrayData,2,0x10);
      }
    }
    message.m_data = local_98.d.ptr;
    message.m_size = local_98.d.size;
    qEncodeHmacMd5(&local_c8.a,&local_78,message);
    pQVar1 = &((phase3->v2Hash).d.d)->super_QArrayData;
    pcVar2 = (phase3->v2Hash).d.ptr;
    (phase3->v2Hash).d.d = local_c8.a.d.d;
    (phase3->v2Hash).d.ptr = local_c8.a.d.ptr;
    qVar3 = (phase3->v2Hash).d.size;
    (phase3->v2Hash).d.size = local_c8.a.d.size;
    local_c8.a.d.d = (Data *)pQVar1;
    local_c8.a.d.ptr = pcVar2;
    local_c8.a.d.size = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,1,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    QCryptographicHash::~QCryptographicHash((QCryptographicHash *)&local_40);
  }
  pDVar4 = (phase3->v2Hash).d.d;
  (__return_storage_ptr__->d).d = pDVar4;
  (__return_storage_ptr__->d).ptr = (phase3->v2Hash).d.ptr;
  (__return_storage_ptr__->d).size = (phase3->v2Hash).d.size;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qCreatev2Hash(const QAuthenticatorPrivate *ctx,
                                QNtlmPhase3Block *phase3)
{
    Q_ASSERT(phase3 != nullptr);
    // since v2 Hash is need for both NTLMv2 and LMv2 it is calculated
    // only once and stored and reused
    if (phase3->v2Hash.size() == 0) {
        QCryptographicHash md4(QCryptographicHash::Md4);
        QByteArray passUnicode = qStringAsUcs2Le(ctx->password);
        md4.addData(passUnicode);

        QByteArray hashKey = md4.result();
        Q_ASSERT(hashKey.size() == 16);
        // Assuming the user and domain is always unicode in challenge
        QByteArray message =
                qStringAsUcs2Le(ctx->extractedUser.toUpper()) +
                qStringAsUcs2Le(phase3->domainStr);

        phase3->v2Hash = qEncodeHmacMd5(hashKey, message);
    }
    return phase3->v2Hash;
}